

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

size_t mserialize::detail::BuiltinSerializer<std::forward_list<int,_std::allocator<int>_>,_void>::
       serialized_size(forward_list<int,_std::allocator<int>_> *s)

{
  size_t sVar1;
  undefined8 in_RDI;
  
  sVar1 = sizeof_elems(in_RDI);
  return sVar1 + 4;
}

Assistant:

static std::size_t serialized_size(const Sequence& s)
  {
    // Note: we are using is_arithmetic to fast-path some types.
    // The correct trait would be has_fixed_size, which could
    // include tuples of fixed size objects and fixed size
    // sequences (std::array, C array) of fixed size objects.
    // However, that would need a lot of code, so we just
    // let the optimizer do the job.
    return sizeof(std::uint32_t)
         + sizeof_elems(std::is_arithmetic<sequence_data_t<const Sequence>>{}, s);
  }